

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f pbrt::SampleUniformDiskConcentric(Point2f *u)

{
  undefined1 auVar1 [16];
  int __x;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Float r;
  Float theta;
  Point2f uOffset;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  Point2<float> *in_stack_ffffffffffffffb0;
  Point2<float> local_38;
  float local_30;
  float local_2c;
  undefined8 local_20;
  undefined8 local_18;
  Tuple2<pbrt::Point2,_float> local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar5._0_8_ = operator*(in_stack_ffffffffffffffac,(Tuple2<pbrt::Point2,_float> *)0x628adb);
  auVar5._8_56_ = extraout_var;
  local_20 = vmovlpd_avx(auVar5._0_16_);
  Vector2<float>::Vector2
            ((Vector2<float> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
             in_stack_ffffffffffffffa8);
  __x = (int)&local_20;
  auVar6._0_8_ = Point2<float>::operator-
                           ((Point2<float> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (Vector2<float> *)0x628b0b);
  auVar6._8_56_ = extraout_var_00;
  local_18 = vmovlpd_avx(auVar6._0_16_);
  if (((((float)local_18 != 0.0) || (NAN((float)local_18))) ||
      (local_18._4_4_ = (float)((ulong)local_18 >> 0x20), local_18._4_4_ != 0.0)) ||
     (NAN(local_18._4_4_))) {
    fVar2 = (float)local_18;
    std::abs(__x);
    fVar3 = local_18._4_4_;
    std::abs(__x);
    if (fVar2 <= fVar3) {
      local_30 = local_18._4_4_;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),
                               ZEXT416((uint)((float)local_18 / local_18._4_4_)),
                               SUB6416(ZEXT464(0x3fc90fdb),0));
      local_2c = auVar1._0_4_;
    }
    else {
      local_30 = (float)local_18;
      local_2c = (local_18._4_4_ / (float)local_18) * 0.7853982;
    }
    fVar2 = local_30;
    dVar4 = std::cos((double)(ulong)(uint)local_2c);
    fVar3 = SUB84(dVar4,0);
    std::sin((double)(ulong)(uint)local_2c);
    Point2<float>::Point2(&local_38,fVar2,fVar3);
    auVar7._0_8_ = operator*(fVar2,(Tuple2<pbrt::Point2,_float> *)0x628c26);
    auVar7._8_56_ = extraout_var_01;
    local_8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7._0_16_);
  }
  else {
    Point2<float>::Point2
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
inline Point2f SampleUniformDiskConcentric(const Point2f &u) {
    // Map _u_ to $[-1,1]^2$ and handle degeneracy at the origin
    Point2f uOffset = 2.f * u - Vector2f(1, 1);
    if (uOffset.x == 0 && uOffset.y == 0)
        return {0, 0};

    // Apply concentric mapping to point
    Float theta, r;
    if (std::abs(uOffset.x) > std::abs(uOffset.y)) {
        r = uOffset.x;
        theta = PiOver4 * (uOffset.y / uOffset.x);
    } else {
        r = uOffset.y;
        theta = PiOver2 - PiOver4 * (uOffset.x / uOffset.y);
    }
    return r * Point2f(std::cos(theta), std::sin(theta));
}